

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O0

char * __thiscall FArchive::ReadName(FArchive *this)

{
  DWORD DVar1;
  uint uVar2;
  NameMap *pNVar3;
  FArchive *pFVar4;
  char *str;
  DWORD size;
  DWORD index_1;
  DWORD index;
  BYTE id;
  FArchive *this_local;
  
  _index = this;
  operator<<(this,(BYTE *)((long)&index_1 + 3));
  if (index_1._3_1_ == '!') {
    this_local = (FArchive *)0x0;
  }
  else if (index_1._3_1_ == '\x1c') {
    DVar1 = ReadCount(this);
    uVar2 = TArray<FArchive::NameMap,_FArchive::NameMap>::Size(&this->m_Names);
    if (uVar2 <= DVar1) {
      I_Error("Name %u has not been read yet\n",(ulong)DVar1);
    }
    pNVar3 = TArray<FArchive::NameMap,_FArchive::NameMap>::operator[](&this->m_Names,(ulong)DVar1);
    this_local = (FArchive *)
                 TArray<char,_char>::operator[](&this->m_NameStorage,(ulong)pNVar3->StringStart);
  }
  else if (index_1._3_1_ == '\x1b') {
    DVar1 = ReadCount(this);
    uVar2 = TArray<char,_char>::Reserve(&this->m_NameStorage,DVar1);
    pFVar4 = (FArchive *)TArray<char,_char>::operator[](&this->m_NameStorage,(ulong)uVar2);
    (*this->_vptr_FArchive[3])(this,pFVar4,(ulong)(DVar1 - 1));
    *(char *)((long)&pFVar4->_vptr_FArchive + (ulong)(DVar1 - 1)) = '\0';
    AddName(this,uVar2);
    this_local = pFVar4;
  }
  else {
    I_Error("Expected a name but got something else\n");
    this_local = (FArchive *)0x0;
  }
  return (char *)this_local;
}

Assistant:

const char *FArchive::ReadName ()
{
	BYTE id;

	operator<< (id);
	if (id == NIL_NAME)
	{
		return NULL;
	}
	else if (id == OLD_NAME)
	{
		DWORD index = ReadCount ();
		if (index >= m_Names.Size())
		{
			I_Error ("Name %u has not been read yet\n", index);
		}
		return &m_NameStorage[m_Names[index].StringStart];
	}
	else if (id == NEW_NAME)
	{
		DWORD index;
		DWORD size = ReadCount ();
		char *str;

		index = (DWORD)m_NameStorage.Reserve (size);
		str = &m_NameStorage[index];
		Read (str, size-1);
		str[size-1] = 0;
		AddName (index);
		return str;
	}
	else
	{
		I_Error ("Expected a name but got something else\n");
		return NULL;
	}
}